

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_x509.cc
# Opt level: O2

int i2d_x509_aux_internal(X509 *a,uchar **pp)

{
  int iVar1;
  int iVar2;
  uchar *puVar3;
  
  if (pp == (uchar **)0x0) {
    puVar3 = (uchar *)0x0;
  }
  else {
    puVar3 = *pp;
    if (puVar3 == (uchar *)0x0) {
      __assert_fail("pp == NULL || *pp != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x_x509.cc"
                    ,0x17b,"int i2d_x509_aux_internal(X509 *, unsigned char **)");
    }
  }
  iVar1 = i2d_X509(a,pp);
  iVar2 = iVar1;
  if ((a != (X509 *)0x0 && 0 < iVar1) && ((X509_CERT_AUX *)a->aux != (X509_CERT_AUX *)0x0)) {
    iVar2 = i2d_X509_CERT_AUX((X509_CERT_AUX *)a->aux,pp);
    if (iVar2 < 0) {
      if (puVar3 != (uchar *)0x0) {
        *pp = puVar3;
      }
    }
    else {
      iVar2 = iVar1 + iVar2;
    }
  }
  return iVar2;
}

Assistant:

static int i2d_x509_aux_internal(X509 *a, unsigned char **pp) {
  int length, tmplen;
  unsigned char *start = pp != NULL ? *pp : NULL;

  assert(pp == NULL || *pp != NULL);

  // This might perturb *pp on error, but fixing that belongs in i2d_X509()
  // not here.  It should be that if a == NULL length is zero, but we check
  // both just in case.
  length = i2d_X509(a, pp);
  if (length <= 0 || a == NULL) {
    return length;
  }

  if (a->aux != NULL) {
    tmplen = i2d_X509_CERT_AUX(a->aux, pp);
    if (tmplen < 0) {
      if (start != NULL) {
        *pp = start;
      }
      return tmplen;
    }
    length += tmplen;
  }

  return length;
}